

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppq.cpp
# Opt level: O2

void __thiscall pg::PPQSolver::solve(PPQSolver *this,int vtop,int pr,int prc,int pe,int po)

{
  ulong *puVar1;
  bitset *Z_00;
  bitset *R;
  bitset *pbVar2;
  uint uVar3;
  uint uVar4;
  uint64_t *puVar5;
  uint64_t *puVar6;
  uint *puVar7;
  int *piVar8;
  Game *pGVar9;
  int *piVar10;
  uint64_t *puVar11;
  bool bVar12;
  int iVar13;
  uint pl;
  ostream *poVar14;
  size_t sVar15;
  int *piVar16;
  ulong uVar17;
  uint vtop_00;
  long lVar18;
  int v_3;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int po_00;
  _label_vertex local_78;
  bitset *local_68;
  bitset Z;
  _label_vertex local_40;
  
  this->iterations = this->iterations + 1;
  if (pe != 0 && po != 0) {
    local_68 = &this->G;
    uVar17 = (ulong)(uint)vtop;
    while (uVar19 = (uint)uVar17, -1 < (int)uVar19) {
      if (((((this->G)._bits[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0) && (this->r[uVar17] <= pr))
         && (this->u[uVar17] <= pr)) goto LAB_0014cf08;
      uVar17 = (ulong)(uVar19 - 1);
    }
    uVar19 = vtop;
    if (vtop < -1) {
LAB_0014cf08:
      if ((pr & 1U) == 0) {
        iVar13 = pe;
        po_00 = po / 2;
      }
      else {
        iVar13 = pe / 2;
        po_00 = po;
      }
      solve(this,uVar19,pr,prc,iVar13,po_00);
      if (1 < (this->super_Solver).trace) {
        poVar14 = std::operator<<((this->super_Solver).logger,"in pr=");
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,pr);
        poVar14 = std::operator<<(poVar14,", pe=");
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,pe);
        poVar14 = std::operator<<(poVar14,", po=");
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,po);
        poVar14 = std::operator<<(poVar14," (caller pr=");
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,prc);
        poVar14 = std::operator<<(poVar14,")");
        std::endl<char,std::char_traits<char>>(poVar14);
      }
      pl = pr & 1;
      for (vtop_00 = uVar19; uVar17 = (ulong)vtop_00, -1 < (int)vtop_00; vtop_00 = vtop_00 - 1) {
        if (((((this->G)._bits[vtop_00 >> 6] >> (uVar17 & 0x3f) & 1) != 0) &&
            (this->r[uVar17] <= pr)) && (this->u[uVar17] <= pr)) goto LAB_0014d020;
      }
      vtop_00 = uVar19;
      if ((int)uVar19 < -1) {
LAB_0014d020:
        sVar15 = (this->R)._bitssize;
        Z_00 = &this->R;
        puVar5 = (this->R)._bits;
        for (lVar18 = 0; sVar15 << 3 != lVar18; lVar18 = lVar18 + 8) {
          *(undefined8 *)((long)puVar5 + lVar18) = 0;
        }
        sVar15 = (this->L)._bitssize;
        puVar6 = (this->L)._bits;
        R = &this->L;
        for (lVar18 = 0; sVar15 << 3 != lVar18; lVar18 = lVar18 + 8) {
          *(undefined8 *)((long)puVar6 + lVar18) = 0;
        }
        puVar7 = (this->Q).queue;
        piVar16 = this->r;
        for (uVar19 = vtop_00; uVar17 = (ulong)uVar19, -1 < (int)uVar19; uVar19 = uVar19 - 1) {
          iVar13 = piVar16[uVar17];
          if (iVar13 != -1) {
            if (iVar13 == pr) {
              puVar1 = puVar5 + (uVar19 >> 6);
              *puVar1 = *puVar1 | 1L << (uVar17 & 0x3f);
              iVar13 = (this->Q).pointer;
              (this->Q).pointer = iVar13 + 1;
              puVar7[iVar13] = uVar19;
              iVar13 = piVar16[uVar17];
            }
            if (iVar13 <= pr) {
              puVar1 = puVar6 + (uVar19 >> 6);
              *puVar1 = *puVar1 | 1L << (uVar17 & 0x3f);
            }
          }
        }
        while( true ) {
          iVar13 = (this->Q).pointer;
          if ((long)iVar13 == 0) break;
          (this->Q).pointer = iVar13 + -1;
          uVar4 = (this->Q).queue[(long)iVar13 + -1];
          this->r[(int)uVar4] = pr;
          attractVertices(this,pl,uVar4,Z_00,R,R);
        }
        if (1 < (this->super_Solver).trace) {
          poVar14 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion \x1b[36m");
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,pr);
          std::operator<<(poVar14,"\x1b[m");
          sVar15 = bitset::find_last(Z_00);
          for (; poVar14 = (this->super_Solver).logger, sVar15 != 0xffffffffffffffff;
              sVar15 = bitset::find_prev(Z_00,sVar15)) {
            poVar14 = std::operator<<(poVar14," \x1b[38;5;38m");
            Z._bits = (uint64_t *)(this->super_Solver).game;
            Z._size._0_4_ = (undefined4)sVar15;
            poVar14 = operator<<(poVar14,(_label_vertex *)&Z);
            std::operator<<(poVar14,"\x1b[m");
          }
          std::endl<char,std::char_traits<char>>(poVar14);
        }
        bVar12 = maybePromote(this,pr,pl,Z_00,R);
        if (!bVar12) {
          bitset::bitset(&Z,Z_00);
          uVar19 = vtop_00;
          uVar21 = 0xffffffff;
          if ((int)vtop_00 < -1) {
            uVar21 = vtop_00;
          }
          for (; uVar17 = (ulong)uVar19, -1 < (int)uVar19; uVar19 = uVar19 - 1) {
            if (((((this->G)._bits[uVar19 >> 6] >> (uVar17 & 0x3f) & 1) != 0) &&
                (this->r[uVar17] < pr)) && (this->u[uVar17] < pr)) goto LAB_0014d272;
          }
          uVar19 = uVar21;
          if ((int)vtop_00 < -1) {
LAB_0014d272:
            uVar19 = this->r[(int)uVar19];
            solve(this,vtop_00,uVar19,pr,pe,po);
            pbVar2 = local_68;
            if (1 < (this->super_Solver).trace) {
              poVar14 = std::operator<<((this->super_Solver).logger,"back from recursive ");
              poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar19);
              poVar14 = std::operator<<(poVar14,", we are pr ");
              poVar14 = (ostream *)std::ostream::operator<<(poVar14,pr);
              poVar14 = std::operator<<(poVar14,", pe=");
              poVar14 = (ostream *)std::ostream::operator<<(poVar14,pe);
              poVar14 = std::operator<<(poVar14,", po=");
              poVar14 = (ostream *)std::ostream::operator<<(poVar14,po);
              std::endl<char,std::char_traits<char>>(poVar14);
            }
            piVar16 = this->u;
            piVar8 = this->r;
            pGVar9 = (this->super_Solver).game;
            piVar10 = this->str;
            for (uVar20 = vtop_00; -1 < (int)uVar20; uVar20 = uVar20 - 1) {
              uVar3 = piVar16[uVar20];
              if ((int)uVar3 < pr && uVar3 != 0xffffffff) {
                if ((uVar3 & 1) == pl) {
LAB_0014d3a9:
                  piVar16[uVar20] = pr;
                }
                else {
                  piVar16[uVar20] = -1;
                  piVar8[uVar20] = pGVar9->_priority[uVar20];
                  piVar10[uVar20] = -1;
                }
              }
              else if (((uVar19 & 1) != pl) && (piVar8[uVar20] < pr && piVar8[uVar20] != -1)) {
                piVar8[uVar20] = -1;
                goto LAB_0014d3a9;
              }
            }
            if (1 < (this->super_Solver).trace) {
              poVar14 = std::operator<<((this->super_Solver).logger,"\x1b[1mstate after Und\x1b[m");
              std::endl<char,std::char_traits<char>>(poVar14);
              sVar15 = bitset::find_last(pbVar2);
              for (; sVar15 != 0xffffffffffffffff; sVar15 = bitset::find_prev(pbVar2,sVar15)) {
                local_78.g = (this->super_Solver).game;
                local_78.v = (int)sVar15;
                poVar14 = operator<<((this->super_Solver).logger,&local_78);
                poVar14 = std::operator<<(poVar14," r=");
                poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->r[sVar15]);
                poVar14 = std::operator<<(poVar14," u=");
                poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->u[sVar15]);
                poVar14 = std::operator<<(poVar14," str=");
                local_40.g = (this->super_Solver).game;
                local_40.v = this->str[sVar15];
                poVar14 = operator<<(poVar14,&local_40);
                std::endl<char,std::char_traits<char>>(poVar14);
              }
            }
            sVar15 = (this->R)._bitssize;
            puVar5 = (this->R)._bits;
            for (lVar18 = 0; sVar15 << 3 != lVar18; lVar18 = lVar18 + 8) {
              *(undefined8 *)((long)puVar5 + lVar18) = 0;
            }
            sVar15 = (this->L)._bitssize;
            puVar6 = (this->L)._bits;
            for (lVar18 = 0; sVar15 << 3 != lVar18; lVar18 = lVar18 + 8) {
              *(undefined8 *)((long)puVar6 + lVar18) = 0;
            }
            sVar15 = (this->U)._bitssize;
            puVar11 = (this->U)._bits;
            pbVar2 = &this->U;
            for (lVar18 = 0; sVar15 << 3 != lVar18; lVar18 = lVar18 + 8) {
              *(undefined8 *)((long)puVar11 + lVar18) = 0;
            }
            puVar7 = (this->Q).queue;
            piVar16 = this->r;
            piVar8 = this->u;
            for (uVar19 = vtop_00; -1 < (int)uVar19; uVar19 = uVar19 - 1) {
              uVar17 = (ulong)uVar19;
              iVar13 = piVar16[uVar17];
              if (iVar13 == pr) {
                puVar1 = puVar5 + (uVar19 >> 6);
                *puVar1 = *puVar1 | 1L << (uVar17 & 0x3f);
              }
              if (iVar13 <= pr && iVar13 != -1) {
                puVar1 = puVar6 + (uVar19 >> 6);
                *puVar1 = *puVar1 | 1L << (uVar17 & 0x3f);
              }
              if (piVar8[uVar17] == pr) {
                puVar1 = puVar11 + (uVar19 >> 6);
                *puVar1 = *puVar1 | 1L << (uVar17 & 0x3f);
                iVar13 = (this->Q).pointer;
                (this->Q).pointer = iVar13 + 1;
                puVar7[iVar13] = uVar19;
              }
            }
            while( true ) {
              iVar13 = (this->Q).pointer;
              if ((long)iVar13 == 0) break;
              (this->Q).pointer = iVar13 + -1;
              uVar4 = (this->Q).queue[(long)iVar13 + -1];
              this->u[(int)uVar4] = pr;
              this->r[(int)uVar4] = -1;
              attractVertices(this,pl ^ 1,uVar4,pbVar2,R,R);
            }
            bitset::operator-=(Z_00,pbVar2);
            bitset::operator-=(R,pbVar2);
            bitset::operator|=(Z_00,&Z);
            sVar15 = bitset::find_first(Z_00);
LAB_0014d643:
            if (sVar15 == 0xffffffffffffffff) {
              maybePromote(this,pr,pl,Z_00,R);
            }
            else {
              uVar19 = this->r[sVar15];
              if (((uVar19 != 0xffffffff) && ((int)uVar19 <= pr || (uVar19 & 1) == pl)) &&
                 (((long)this->str[sVar15] == -1 || (this->r[this->str[sVar15]] == pr))))
              goto LAB_0014d686;
              for (uVar19 = vtop_00; -1 < (int)uVar19; uVar19 = uVar19 - 1) {
                piVar16 = this->r;
                if (piVar16[uVar19] <= pr && piVar16[uVar19] != -1) {
                  if (1 < (this->super_Solver).trace) {
                    poVar14 = std::operator<<((this->super_Solver).logger,"reset ");
                    local_78.g = (this->super_Solver).game;
                    local_78.v = uVar19;
                    poVar14 = operator<<(poVar14,&local_78);
                    std::endl<char,std::char_traits<char>>(poVar14);
                    piVar16 = this->r;
                  }
                  piVar16[uVar19] = ((this->super_Solver).game)->_priority[uVar19];
                  this->u[uVar19] = -1;
                  this->str[uVar19] = -1;
                }
              }
              uVar19 = vtop_00;
              while( true ) {
                uVar17 = (ulong)uVar19;
                if ((int)uVar19 < 0) {
                  uVar19 = uVar21;
                  if ((int)vtop_00 < -1) break;
                  goto LAB_0014d7de;
                }
                if (((((this->G)._bits[uVar19 >> 6] >> (uVar17 & 0x3f) & 1) != 0) &&
                    (this->r[uVar17] <= pr)) && (this->u[uVar17] <= pr)) break;
                uVar19 = uVar19 - 1;
              }
              if (pl == 0) {
                po = po / 2;
              }
              else {
                pe = pe / 2;
              }
              solve(this,uVar19,pr,prc,pe,po);
            }
          }
LAB_0014d7de:
          bitset::~bitset(&Z);
        }
      }
    }
  }
  return;
LAB_0014d686:
  sVar15 = bitset::find_next(Z_00,sVar15);
  goto LAB_0014d643;
}

Assistant:

void
PPQSolver::solve(int vtop, const int pr, const int prc, const int pe, const int po)
{
    // track the number of visits
    iterations++;

    // no state change
    if (po == 0 || pe == 0) return;

    // move vtop to the true top, then check for game emptiness
    while (vtop >= 0 and (!G[vtop] or r[vtop] > pr or u[vtop] > pr)) vtop--;
    if (vtop == -1) return; // empty game, bye

    // const int pr = r[vtop]; // set to highest priority
    const int pl = pr&1;

    // Expand the left side of the current level of the universal tree
    // This is where we use Lehtinen's version, not Pawel's.
    if (pl == 0) solve(vtop, pr, prc, pe, po/2);
    else solve(vtop, pr, prc, pe/2, po);

#ifndef NDEBUG
    if (trace >= 2) logger << "in pr=" << pr << ", pe=" << pe << ", po=" << po << " (caller pr=" << prc << ")" << std::endl;
#endif

    // after the left side, a lot can be changed, find our new vtop

    while (vtop >= 0 and (!G[vtop] or r[vtop] > pr or u[vtop] > pr)) vtop--;
    if (vtop == -1) return; // empty game, bye

    // TODO handle some special cases: entire region in u; nothing left in r; L is smaller than pe/po

    // set R := all vertices with r[v] == pr
    // set L := all vertices with r[v] <= pr and r[v] != -1
    // also add each vertex in R to the attract queue Q

    R.reset();
    L.reset();
    for (int v = vtop; v >= 0; v--) {
        // assumption: if v not in G, then r[v] == -1
        if (r[v] != -1) {
            if (r[v] == pr) {
                R[v] = true; // add to R
                Q.push(v);   // add to Q
            } 
            if (r[v] <= pr) {
                L[v] = true; // add to L
            }
        }
    } 

    // Attract for pl from L to R

    while (Q.nonempty()) {
        int v = Q.pop();
        r[v] = pr;    // set r ; we already know/assume that u[v] == -1
        // L[v] = false; // remove from L
        attractVertices(pl, v, R, L, L);
    }

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "\033[1;33mregion \033[36m" << pr << "\033[m";
        for (auto v = R.find_last(); v != bitset::npos; v = R.find_prev(v)) {
            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m"; 
        }
        logger << std::endl;
    }
#endif

    // Now that we have our R, check if it is closed.
    // Simultaneously find lowest escape out of R (for the opponent)

    bool promoted = maybePromote(pr, pl, R, L);

    // if promoted, we don't need to consider the recursive game (according to the paper)
    if (promoted) return;

    // if (promoted) R.reset(); // alternative...

    /** /
    // optimization to not continue if we can be sure that the recursion already took all
    // possible opponent's small dominions
    //
    // sadly, this does not work well with the PP optimization
    L -= R;
    unsigned long count = L.count(); // what remains ?
    if (pl) {
        if (count <= (po/2)) return;
    } else {
        if (count <= (pe/2)) return;
    }
    // */

    // make a local copy of R, because R/L can be destroyed in the recursion
    bitset Z(R);

    // compute next vtop (for subgame) and the next priority
    int next_vtop = vtop;
    while (next_vtop >= 0 and (!G[next_vtop] or r[next_vtop] >= pr or u[next_vtop] >= pr)) next_vtop--;
    if (next_vtop == -1) return; // subgame is actually empty
    const int subpr = r[next_vtop];

    // run recursively
    solve(vtop, subpr, pr, pe, po);

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "back from recursive " << subpr << ", we are pr " << pr << ", pe=" << pe << ", po=" << po << std::endl;
    }
#endif

    // Now we must first perform Und
    // There may be a lower u. If same pl pr, then merge with our u. If different pl pr, reset.
    // There may be a lower r. If other pl, then merge to our u

    for (int v = vtop; v >= 0; v--) {
        if (u[v] != -1 and u[v] < pr) {
            // lower u
            if ((u[v]&1) == pl) {
                // same pl pr, so merge
                u[v] = pr;
            } else {
                // other pl pr, so reset
                u[v] = -1;
                r[v] = priority(v);
                str[v] = -1;
            }
        } else if ((subpr&1)!=pl and r[v] != -1 and r[v] < pr) {
            // it's a lower other pl r, merge to our u
            r[v] = -1;
            u[v] = pr;
        }
    }

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "\033[1mstate after Und\033[m" << std::endl;
        for (auto v = G.find_last(); v != bitset::npos; v = G.find_prev(v)) {
            logger << label_vertex(v) << " r=" << r[v] << " u=" << u[v] << " str=" << label_vertex(str[v]) << std::endl;
        }
    }
#endif

    // after the recursion, R/U/L could be anything...
    // set R := all vertices with r[v] == pr
    // set U := all vertices with u[v] == pr
    // set L := all vertices with r[v] <= pr
    // also add each vertex in U to the attract queue Q

    R.reset();  
    L.reset();
    U.reset();
    for (int v = vtop; v >= 0; v--) {
        if (r[v] == pr) {
            R[v] = true; // add to R
        }
        if (r[v] != -1 && r[v] <= pr) {
            L[v] = true; // add to L
        }
        if (u[v] == pr) {
            U[v] = true; // add to U
            Q.push(v);   // add to Q for attracting from R/L to U
        }
    } 

    // Attract to U from L
    while (Q.nonempty()) {
        int v = Q.pop();
        u[v] = pr;
        r[v] = -1;
        attractVertices(1-pl, v, U, L, L);
    }

    // Update R and L
    R -= U;
    L -= U;

    // Add original R to current R in order to check if we need to reset R
    R |= Z;

    // check if we need to reset the region
    bool reset_R = false;
    for (auto v = R.find_first(); v != bitset::npos; v = R.find_next(v)) {
        // check if a vertex is now in a dominion or in u
        if (r[v] == -1) {
            reset_R = true; // either dominion or in u
            break;
        }
        // check if a vertex is in a higher opponent r
        if (r[v] > pr && (r[v]&1) != pl) {
            reset_R = true;
            break;
        }
        // check if a strategy leaves R
        if (str[v] != -1 && r[str[v]] != pr) {
            reset_R = true;
            break;
        }
    }

    if (reset_R) {
        // reset everything with r <= pr
        for (auto v = vtop; v >= 0; v--) {
            if (r[v] != -1 && r[v] <= pr) {
#ifndef NDEBUG
                if (trace >= 2) logger << "reset " << label_vertex(v) << std::endl;
#endif
                r[v] = priority(v);
                u[v] = -1;
                str[v] = -1;
            }
        }
    } else {
        // we did not reset, try to promote again
        maybePromote(pr, pl, R, L);
        // regardless of the outcome, if nothing reset, no need to go recursive again
        return;
    }

    // move vtop then expand right side of the universal tree
    while (vtop >= 0 and (!G[vtop] or r[vtop] > pr or u[vtop] > pr)) vtop--;
    if (vtop == -1) return; // and we're done, there's nothing left

    // Expand the right side of the current level of the universal tree
    if (pl == 0) solve(vtop, pr, prc, pe, po/2);
    else solve(vtop, pr, prc, pe/2, po);
}